

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O2

void ** __thiscall icu_63::UVector::toArray(UVector *this,void **result)

{
  int iVar1;
  int i;
  long lVar2;
  void **a;
  
  iVar1 = this->count;
  for (lVar2 = 0; lVar2 < iVar1; lVar2 = lVar2 + 1) {
    *(UElement *)(result + lVar2) = this->elements[lVar2];
  }
  return result;
}

Assistant:

void** UVector::toArray(void** result) const {
    void** a = result;
    for (int i=0; i<count; ++i) {
        *a++ = elements[i].pointer;
    }
    return result;
}